

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O3

void __thiscall
flow::lang::HandlerSym::implement
          (HandlerSym *this,
          unique_ptr<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_> *table,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *body)

{
  pointer __p;
  Stmt *pSVar1;
  Stmt *pSVar2;
  
  __p = (table->_M_t).
        super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>
        .super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl;
  (table->_M_t).
  super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>._M_t
  .super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>.
  super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl = (SymbolTable *)0x0;
  std::__uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>::
  reset((__uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_> *)
        &this->scope_,__p);
  pSVar1 = (body->_M_t).
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
  super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
  super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl = (Stmt *)0x0;
  pSVar2 = (this->body_)._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  (this->body_)._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
  ._M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
  super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl = pSVar1;
  if (pSVar2 != (Stmt *)0x0) {
    (**(code **)((long)(pSVar2->super_ASTNode)._vptr_ASTNode + 8))();
    return;
  }
  return;
}

Assistant:

void HandlerSym::implement(std::unique_ptr<SymbolTable>&& table,
                           std::unique_ptr<Stmt>&& body) {
  scope_ = std::move(table);
  body_ = std::move(body);
}